

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall duckdb_re2::Compiler::FindByteRange(Compiler *this,int root,int id)

{
  uint8_t uVar1;
  int iVar2;
  Inst *pIVar3;
  Frag FVar4;
  bool bVar5;
  uint uVar6;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  undefined4 uStack_188;
  uint uStack_184;
  ios_base local_118 [264];
  
  pIVar3 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
  if ((pIVar3[root].out_opcode_ & 7) == 2) {
    if (((pIVar3[root].field_1.byte_range.lo_ == pIVar3[id].field_1.byte_range.lo_) &&
        (pIVar3[root].field_1.byte_range.hi_ == pIVar3[id].field_1.byte_range.hi_)) &&
       (((pIVar3[id].field_1.byte_range.hint_foldcase_ ^
         pIVar3[root].field_1.byte_range.hint_foldcase_) & 1) == 0)) {
      uStack_19c = 0;
      uStack_198 = 0;
      uStack_194 = uStack_194 & 0xffffff00;
      local_1a0 = root;
    }
    else {
LAB_0048677b:
      local_1a0 = 0;
      uStack_19c = 0;
      uStack_198 = 0;
      uStack_194 = uStack_194 & 0xffffff00;
    }
  }
  else {
    do {
      if ((pIVar3[root].out_opcode_ & 7) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_188);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_188,"should never happen",0x13);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_188);
        std::ios_base::~ios_base(local_118);
        goto LAB_0048677b;
      }
      iVar2 = pIVar3[root].field_1.cap_;
      uVar1 = pIVar3[id].field_1.byte_range.lo_;
      if (((pIVar3[iVar2].field_1.byte_range.lo_ == uVar1) &&
          (pIVar3[iVar2].field_1.byte_range.hi_ == pIVar3[id].field_1.byte_range.hi_)) &&
         (((pIVar3[id].field_1.byte_range.hint_foldcase_ ^
           pIVar3[iVar2].field_1.byte_range.hint_foldcase_) & 1) == 0)) {
        uStack_19c = root * 2 + 1;
LAB_0048669a:
        uStack_198 = uStack_19c / 1;
        local_1a0 = root;
LAB_004866e1:
        uStack_194 = uStack_194 & 0xffffff00;
        bVar5 = false;
      }
      else {
        if ((this->reversed_ & 1U) == 0) {
LAB_004866ae:
          uStack_188 = 0;
          uStack_184 = uStack_184 & 0xffffff00;
          local_1a0 = 0;
          uStack_19c = 0;
          uStack_198 = 0;
          goto LAB_004866e1;
        }
        uVar6 = pIVar3[root].out_opcode_ >> 4;
        if ((pIVar3[uVar6].out_opcode_ & 7) != 0) {
          if (((pIVar3[uVar6].field_1.byte_range.lo_ == uVar1) &&
              (pIVar3[uVar6].field_1.byte_range.hi_ == pIVar3[id].field_1.byte_range.hi_)) &&
             (((pIVar3[id].field_1.byte_range.hint_foldcase_ ^
               pIVar3[uVar6].field_1.byte_range.hint_foldcase_) & 1) == 0)) {
            uStack_19c = root * 2;
            goto LAB_0048669a;
          }
          goto LAB_004866ae;
        }
        bVar5 = true;
        root = uVar6;
      }
    } while (bVar5);
  }
  FVar4.end.head = uStack_19c;
  FVar4.begin = local_1a0;
  FVar4.end.tail = uStack_198;
  FVar4._12_4_ = uStack_194;
  return FVar4;
}

Assistant:

Frag Compiler::FindByteRange(int root, int id) {
  if (inst_[root].opcode() == kInstByteRange) {
    if (ByteRangeEqual(root, id))
      return Frag(root, kNullPatchList, false);
    else
      return NoMatch();
  }

  while (inst_[root].opcode() == kInstAlt) {
    int out1 = inst_[root].out1();
    if (ByteRangeEqual(out1, id))
      return Frag(root, PatchList::Mk((root << 1) | 1), false);

    // CharClass is a sorted list of ranges, so if out1 of the root Alt wasn't
    // what we're looking for, then we can stop immediately. Unfortunately, we
    // can't short-circuit the search in reverse mode.
    if (!reversed_)
      return NoMatch();

    int out = inst_[root].out();
    if (inst_[out].opcode() == kInstAlt)
      root = out;
    else if (ByteRangeEqual(out, id))
      return Frag(root, PatchList::Mk(root << 1), false);
    else
      return NoMatch();
  }

  LOG(DFATAL) << "should never happen";
  return NoMatch();
}